

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-pattern-1.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  int j;
  uint uVar4;
  int i;
  uint uVar5;
  undefined8 uStack_28;
  
  uVar5 = 0;
  uStack_28 = in_RAX;
  do {
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      if (uVar5 >= uVar4 && uVar5 != uVar4) {
        uVar3 = uVar5;
      }
      uVar2 = uVar4;
      if (uVar5 < uVar4) {
        uVar2 = uVar5;
      }
      iVar1 = uVar3 - 3;
      if (uVar5 + uVar4 < 9) {
        iVar1 = 5 - uVar2;
      }
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
      uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    uVar5 = uVar5 + 1;
  } while (uVar5 != 9);
  return 0;
}

Assistant:

int main() {
  int A = 5;
  int B = (2 * A) - 1;
  for (int i = 0; i < B; i++) {
    for (int j = 0; j < B; j++) {
      if (i + j < B) {
        if (i <= j) {
          cout << A - i;
        } else {
          cout << A - j;
        }
      } else {
        if (i <= j) {
          cout << j - A + 2;
        } else {
          cout << i - A + 2;
        }
      }

      cout << ' ';
    }
    cout << endl;
  }
}